

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void constInsert(WhereConst *pConst,Expr *pColumn,Expr *pValue,Expr *pExpr)

{
  char cVar1;
  int iVar2;
  CollSeq *p;
  Expr **ppEVar3;
  Expr *pE2;
  int i;
  Expr *pExpr_local;
  Expr *pValue_local;
  Expr *pColumn_local;
  WhereConst *pConst_local;
  
  if (((pColumn->flags & 0x20) == 0) && (cVar1 = sqlite3ExprAffinity(pValue), cVar1 == '\0')) {
    p = sqlite3ExprCompareCollSeq(pConst->pParse,pExpr);
    iVar2 = sqlite3IsBinary(p);
    if (iVar2 != 0) {
      for (pE2._4_4_ = 0; pE2._4_4_ < pConst->nConst; pE2._4_4_ = pE2._4_4_ + 1) {
        if ((pConst->apExpr[pE2._4_4_ << 1]->iTable == pColumn->iTable) &&
           (pConst->apExpr[pE2._4_4_ << 1]->iColumn == pColumn->iColumn)) {
          return;
        }
      }
      cVar1 = sqlite3ExprAffinity(pColumn);
      if (cVar1 == 'A') {
        pConst->bHasAffBlob = 1;
      }
      pConst->nConst = pConst->nConst + 1;
      ppEVar3 = (Expr **)sqlite3DbReallocOrFree
                                   (pConst->pParse->db,pConst->apExpr,
                                    (long)(pConst->nConst << 1) << 3);
      pConst->apExpr = ppEVar3;
      if (pConst->apExpr == (Expr **)0x0) {
        pConst->nConst = 0;
      }
      else {
        pConst->apExpr[pConst->nConst * 2 + -2] = pColumn;
        pConst->apExpr[pConst->nConst * 2 + -1] = pValue;
      }
    }
  }
  return;
}

Assistant:

static void constInsert(
  WhereConst *pConst,  /* The WhereConst into which we are inserting */
  Expr *pColumn,       /* The COLUMN part of the constraint */
  Expr *pValue,        /* The VALUE part of the constraint */
  Expr *pExpr          /* Overall expression: COLUMN=VALUE or VALUE=COLUMN */
){
  int i;
  assert( pColumn->op==TK_COLUMN );
  assert( sqlite3ExprIsConstant(pValue) );

  if( ExprHasProperty(pColumn, EP_FixedCol) ) return;
  if( sqlite3ExprAffinity(pValue)!=0 ) return;
  if( !sqlite3IsBinary(sqlite3ExprCompareCollSeq(pConst->pParse,pExpr)) ){
    return;
  }

  /* 2018-10-25 ticket [cf5ed20f]
  ** Make sure the same pColumn is not inserted more than once */
  for(i=0; i<pConst->nConst; i++){
    const Expr *pE2 = pConst->apExpr[i*2];
    assert( pE2->op==TK_COLUMN );
    if( pE2->iTable==pColumn->iTable
     && pE2->iColumn==pColumn->iColumn
    ){
      return;  /* Already present.  Return without doing anything. */
    }
  }
  if( sqlite3ExprAffinity(pColumn)==SQLITE_AFF_BLOB ){
    pConst->bHasAffBlob = 1;
  }

  pConst->nConst++;
  pConst->apExpr = sqlite3DbReallocOrFree(pConst->pParse->db, pConst->apExpr,
                         pConst->nConst*2*sizeof(Expr*));
  if( pConst->apExpr==0 ){
    pConst->nConst = 0;
  }else{
    pConst->apExpr[pConst->nConst*2-2] = pColumn;
    pConst->apExpr[pConst->nConst*2-1] = pValue;
  }
}